

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O1

char * tnt_buf_resize(tnt_stream *s,size_t size)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  char *pcVar4;
  size_t size_00;
  
  puVar1 = (undefined8 *)s->data;
  lVar2 = puVar1[1];
  size_00 = size + lVar2;
  pvVar3 = tnt_mem_realloc((void *)*puVar1,size_00);
  if (pvVar3 == (void *)0x0) {
    tnt_mem_free((void *)*puVar1);
    pcVar4 = (char *)0x0;
  }
  else {
    *puVar1 = pvVar3;
    puVar1[2] = size_00;
    pcVar4 = (char *)(lVar2 + (long)pvVar3);
  }
  return pcVar4;
}

Assistant:

static char* tnt_buf_resize(struct tnt_stream *s, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	size_t off = sb->size;
	size_t nsize = off + size;
	char *nd = tnt_mem_realloc(sb->data, nsize);
	if (nd == NULL) {
		tnt_mem_free(sb->data);
		return NULL;
	}
	sb->data = nd;
	sb->alloc = nsize;
	return sb->data + off;
}